

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReparserTester.cpp
# Opt level: O2

void __thiscall
psy::C::ReparserTester::reparse_withSyntaxCorrelation
          (ReparserTester *this,string *text,Expectation *X)

{
  InternalsTestSuite *this_00;
  string sStack_e8;
  Expectation local_c8;
  
  this_00 = (InternalsTestSuite *)(this->super_Tester).suite_;
  std::__cxx11::string::string((string *)&sStack_e8,(string *)text);
  Expectation::Expectation(&local_c8,X);
  InternalsTestSuite::reparse_withSyntaxCorrelation(this_00,&sStack_e8,&local_c8);
  Expectation::~Expectation(&local_c8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  return;
}

Assistant:

void ReparserTester::reparse_withSyntaxCorrelation(std::string text, Expectation X)
{
    (static_cast<InternalsTestSuite*>(suite_)->reparse_withSyntaxCorrelation(text, X));
}